

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_select.c
# Opt level: O2

ssize_t tnt_select(tnt_stream *s,uint32_t space,uint32_t index,uint32_t limit,uint32_t offset,
                  uint8_t iterator,tnt_stream *key)

{
  uint64_t num;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  ssize_t sVar5;
  long lVar6;
  undefined2 local_f8;
  char local_f6 [6];
  char body [64];
  tnt_iheader hdr;
  void *local_88;
  iovec v [4];
  undefined1 local_39;
  undefined1 auStack_38 [7];
  char len_prefix [9];
  
  iVar1 = tnt_object_verify(key,'\x05');
  if (iVar1 == 0) {
    num = s->reqid;
    s->reqid = num + 1;
    body[0x38] = -0x7e;
    body[0x39] = '\0';
    body[0x3a] = '\x01';
    body[0x3b] = '\x01';
    body[0x3c] = '\0';
    body[0x3d] = '\0';
    body[0x3e] = '\0';
    body[0x3f] = '\0';
    v[3].iov_len = (size_t)s;
    pcVar3 = mp_encode_uint(body + 0x3c,num);
    v[0].iov_len = (size_t)(body + 0x38);
    v[1].iov_base = pcVar3 + -v[0].iov_len;
    local_f8 = 0x1086;
    pcVar3 = mp_encode_uint(local_f6,(ulong)space);
    *pcVar3 = '\x11';
    pcVar3 = mp_encode_uint(pcVar3 + 1,(ulong)index);
    *pcVar3 = '\x12';
    pcVar3 = mp_encode_uint(pcVar3 + 1,(ulong)limit);
    *pcVar3 = '\x13';
    pcVar3 = mp_encode_uint(pcVar3 + 1,(ulong)offset);
    *pcVar3 = '\x14';
    pcVar3 = mp_encode_uint(pcVar3 + 1,(ulong)iterator);
    *pcVar3 = ' ';
    v[1].iov_len = (size_t)&local_f8;
    v[2].iov_base = pcVar3 + (1 - (long)&local_f8);
    v[2].iov_len = *key->data;
    v[3].iov_base = *(void **)((long)key->data + 8);
    uVar4 = 0;
    for (lVar6 = 0x18; lVar6 != 0x48; lVar6 = lVar6 + 0x10) {
      uVar4 = uVar4 + *(long *)((long)v + lVar6 + -8);
    }
    if (uVar4 >> 0x20 == 0) {
      uVar2 = (uint)uVar4;
      _auStack_38 = CONCAT44(stack0xffffffffffffffcc,
                             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18);
      local_39 = 0xce;
      pcVar3 = auStack_38 + 4;
    }
    else {
      _auStack_38 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                    (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                    (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                    (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      local_39 = 0xcf;
      pcVar3 = len_prefix + 1;
    }
    local_88 = &local_39;
    v[0].iov_base = pcVar3 + -(long)local_88;
    sVar5 = (**(code **)(v[3].iov_len + 0x10))(v[3].iov_len,&local_88,4);
  }
  else {
    sVar5 = -1;
  }
  return sVar5;
}

Assistant:

ssize_t
tnt_select(struct tnt_stream *s, uint32_t space, uint32_t index,
	   uint32_t limit, uint32_t offset, uint8_t iterator,
	   struct tnt_stream *key)
{
	if (tnt_object_verify(key, MP_ARRAY))
		return -1;
	struct tnt_iheader hdr;
	struct iovec v[4]; int v_sz = 4;
	char *data = NULL;
	encode_header(&hdr, TNT_OP_SELECT, s->reqid++);
	v[1].iov_base = (void *)hdr.header;
	v[1].iov_len  = hdr.end - hdr.header;
	char body[64]; data = body;

	data = mp_encode_map(data, 6);
	data = mp_encode_uint(data, TNT_SPACE);
	data = mp_encode_uint(data, space);
	data = mp_encode_uint(data, TNT_INDEX);
	data = mp_encode_uint(data, index);
	data = mp_encode_uint(data, TNT_LIMIT);
	data = mp_encode_uint(data, limit);
	data = mp_encode_uint(data, TNT_OFFSET);
	data = mp_encode_uint(data, offset);
	data = mp_encode_uint(data, TNT_ITERATOR);
	data = mp_encode_uint(data, iterator);
	data = mp_encode_uint(data, TNT_KEY);
	v[2].iov_base = body;
	v[2].iov_len  = data - body;
	v[3].iov_base = TNT_SBUF_DATA(key);
	v[3].iov_len  = TNT_SBUF_SIZE(key);

	size_t package_len = 0;
	for (int i = 1; i < v_sz; ++i)
		package_len += v[i].iov_len;
	char len_prefix[9];
	char *len_end = mp_encode_luint32(len_prefix, package_len);
	v[0].iov_base = len_prefix;
	v[0].iov_len = len_end - len_prefix;
	return s->writev(s, v, v_sz);
}